

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O1

wostream * Centaurus::printc(wostream *os,char ch)

{
  int iVar1;
  wostream *pwVar2;
  size_t sVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  wchar_t *pwVar5;
  wchar_t buf [16];
  wchar_t local_58 [16];
  
  uVar4 = CONCAT71(in_register_00000031,ch) & 0xffffffff;
  iVar1 = isgraph((int)CONCAT71(in_register_00000031,ch));
  if (iVar1 == 0) {
    swprintf(local_58,0x10,L"\\\\x%0X",uVar4);
    sVar3 = wcslen(local_58);
LAB_0011798d:
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_58,sVar3);
    return pwVar2;
  }
  if ((char)uVar4 == '\\') {
    pwVar5 = L"\\\\";
  }
  else {
    if (ch != '\"') {
      if (*(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0) == (long *)0x0) {
        std::__throw_bad_cast();
      }
      local_58[0] = (**(code **)(**(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0) + 0x50))();
      sVar3 = 1;
      goto LAB_0011798d;
    }
    pwVar5 = L"\\\"";
  }
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,pwVar5,2);
  return pwVar2;
}

Assistant:

static std::wostream& printc(std::wostream& os, char ch)
{
	if (!isgraph(ch))
	{
		wchar_t buf[16];
		swprintf(buf, 16, L"\\\\x%0X", (int)ch);
		return os << buf;
	}
	else
	{
		switch (ch)
		{
		case '"':
			return os << L"\\\"";
		case '\\':
			return os << L"\\\\";
		default:
			return os << os.widen(ch);
		}
	}
}